

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

TranslationBlock_conflict *
tb_gen_code_mipsel(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                  uint32_t flags,int cflags)

{
  ushort uVar1;
  TCGContext_conflict6 *s;
  CPUArchState_conflict8 *pCVar2;
  TCGContext_conflict6 *pTVar3;
  byte *pbVar4;
  uc_struct_conflict7 *uc;
  uintptr_t uVar5;
  uintptr_t *puVar6;
  PageDesc *pPVar7;
  tb_page_addr_t tVar8;
  TranslationBlock_conflict *pTVar9;
  ulong extraout_RAX;
  TranslationBlock_conflict *tb;
  long lVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  byte *pbVar14;
  uint16_t *puVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  ulong uVar17;
  target_ulong_conflict tVar18;
  byte bVar19;
  tb_page_addr_t phys2;
  bool bVar20;
  bool bVar21;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_90;
  uint local_88;
  undefined4 uStack_84;
  void *local_80;
  uint32_t local_78;
  uint local_74;
  target_ulong_conflict local_70;
  uint32_t local_6c;
  byte *local_68;
  tb_page_addr_t local_60;
  undefined8 local_58;
  CPUArchState_conflict8 *local_50;
  ulong local_48;
  CPUState *local_40;
  TranslationBlock_conflict *local_38;
  
  local_58 = CONCAT44(in_register_00000034,pc);
  s = cpu->uc->tcg_ctx;
  pCVar2 = (CPUArchState_conflict8 *)cpu->env_ptr;
  local_70 = cs_base;
  local_6c = flags;
  local_60 = get_page_addr_code_mipsel(pCVar2,pc);
  uVar12 = cflags | 0x10000;
  if (local_60 != 0xffffffffffffffff) {
    uVar12 = cflags;
  }
  uVar11 = cpu->cluster_index;
  tb = (TranslationBlock_conflict *)(ulong)uVar11;
  uVar16 = cpu->singlestep_enabled;
  puVar15 = (uint16_t *)(ulong)uVar16;
  pTVar9 = tcg_tb_alloc_mipsel((TCGContext_conflict4 *)s);
  if (pTVar9 == (TranslationBlock_conflict *)0x0) {
LAB_007ecfb2:
    tb_gen_code_mipsel_cold_2();
LAB_007ecfbc:
    (tb->tc).size = local_48;
    s->code_gen_ptr =
         (void *)((long)local_80 + ((ulong)puVar15 & 0xffffffff) + local_48 + 0xf &
                 0xfffffffffffffff0);
    *(undefined1 (*) [16])(tb->jmp_list_next + 1) = (undefined1  [16])0x0;
    tb->jmp_list_head = 0;
    tb->jmp_list_next[0] = 0;
    tb->jmp_dest[1] = 0;
    if ((ulong)tb->jmp_reset_offset[0] != 0xffff) {
      tb_set_jmp_target_mipsel(tb,0,(ulong)tb->jmp_reset_offset[0] + (long)(tb->tc).ptr);
    }
    pCVar2 = local_50;
    if (tb->jmp_reset_offset[1] != 0xffff) {
      tb_set_jmp_target_mipsel(tb,1,(ulong)tb->jmp_reset_offset[1] + (long)(tb->tc).ptr);
    }
    uVar12 = ((uint)local_58 + (uint)tb->size) - 1 & 0xfffff000;
    phys2 = 0xffffffffffffffff;
    if (((uint)local_58 & 0xfffff000) != uVar12) {
      phys2 = get_page_addr_code_mipsel(pCVar2,uVar12);
    }
    tVar8 = local_60;
    uc = cpu->uc;
    local_90 = (PageDesc *)0x0;
    pTVar9 = tb;
    if (local_60 == 0xffffffffffffffff) {
      if ((tb->cflags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
      *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 0xc) = 0xffffffff;
    }
    else {
      page_lock_pair((uc_struct_conflict5 *)uc,(PageDesc **)&local_88,local_60,&local_90,phys2,1);
      puVar6 = (uintptr_t *)CONCAT44(uStack_84,local_88);
      uVar17 = (ulong)((uint)tVar8 & 0xfffff000);
      tb->page_addr[0] = uVar17;
      tb->page_next[0] = *puVar6;
      uVar5 = *puVar6;
      *puVar6 = (uintptr_t)tb;
      g_free((gpointer)puVar6[1]);
      puVar6[1] = 0;
      *(undefined4 *)(puVar6 + 2) = 0;
      if (uVar5 == 0) {
        tlb_protect_code_mipsel((uc_struct_conflict5 *)uc,uVar17);
      }
      pPVar7 = local_90;
      if (local_90 == (PageDesc *)0x0) {
        tb->page_addr[1] = 0xffffffffffffffff;
      }
      else {
        tb->page_addr[1] = phys2;
        tb->page_next[1] = local_90->first_tb;
        uVar5 = local_90->first_tb;
        local_90->first_tb = (ulong)tb | 1;
        g_free(local_90->code_bitmap);
        pPVar7->code_bitmap = (unsigned_long *)0x0;
        pPVar7->code_write_count = 0;
        if (uVar5 == 0) {
          tlb_protect_code_mipsel((uc_struct_conflict5 *)uc,phys2);
        }
      }
      if ((tb->cflags >> 0x10 & 1) == 0) {
        local_38 = (TranslationBlock_conflict *)0x0;
        uVar12 = (int)local_60 * -0x7a143589 + 0x24234429;
        uVar11 = uVar12 * 0x2000 | uVar12 >> 0x13;
        uVar12 = (int)(local_60 >> 0x20) * -0x7a143589 + 0x85ebca78;
        uVar12 = uVar12 * 0x2000 | uVar12 >> 0x13;
        uVar16 = tb->pc * -0x7a143589 + 1;
        uVar16 = uVar16 * 0x2000 | uVar16 >> 0x13;
        uVar12 = (uVar16 * 0x779b1000 | uVar16 * -0x61c8864f >> 0x14) +
                 tb->flags * -0x3d4d51c3 +
                 (uVar11 * 0x3c6ef362 | (uint)((int)(uVar11 * -0x61c8864f) < 0)) +
                 (uVar12 * 0x1bbcd880 | uVar12 * -0x61c8864f >> 0x19) + 0x91a7a6fd;
        uVar12 = (tb->cflags & 0xff0affff) * -0x3d4d51c3 +
                 (uVar12 * 0x20000 | uVar12 >> 0xf) * 0x27d4eb2f;
        uVar12 = tb->trace_vcpu_dstate * -0x3d4d51c3 +
                 (uVar12 * 0x20000 | uVar12 >> 0xf) * 0x27d4eb2f;
        uVar12 = (uVar12 * 0x20000 | uVar12 >> 0xf) * 0x27d4eb2f;
        uVar12 = (uVar12 >> 0xf ^ uVar12) * -0x7a143589;
        uVar12 = (uVar12 >> 0xd ^ uVar12) * -0x3d4d51c3;
        uVar12 = uVar12 >> 0x10 ^ uVar12;
        tb->hash = uVar12;
        qht_insert((uc_struct_conflict5 *)uc,(qht *)(uc->tcg_ctx->gen_insn_data + 0x100),tb,uVar12,
                   &local_38);
        if (local_38 != (TranslationBlock_conflict *)0x0) {
          tb_page_remove((PageDesc *)CONCAT44(uStack_84,local_88),tb);
          lVar10 = CONCAT44(uStack_84,local_88);
          g_free(*(gpointer *)(lVar10 + 8));
          *(undefined8 *)(lVar10 + 8) = 0;
          *(undefined4 *)(lVar10 + 0x10) = 0;
          pTVar9 = local_38;
          if (local_90 != (PageDesc *)0x0) {
            tb_page_remove(local_90,tb);
            pPVar7 = local_90;
            g_free(local_90->code_bitmap);
            pPVar7->code_bitmap = (unsigned_long *)0x0;
            pPVar7->code_write_count = 0;
            pTVar9 = local_38;
          }
        }
      }
    }
    if (pTVar9 == tb) {
      tcg_tb_insert_mipsel((TCGContext_conflict4 *)s,tb);
      pTVar9 = tb;
    }
    else {
      lVar10 = (long)((uc_struct_conflict5 *)s->gen_insn_data[0x107][2])->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_80 - (-lVar10 & lVar10 + 0x97U));
    }
    return pTVar9;
  }
  local_78 = uVar11 << 0x18 | uVar12 & 0xffffff;
  uVar12 = uVar12 & 0x7fff;
  uVar11 = 0x200;
  if (uVar12 < 0x200) {
    uVar11 = uVar12;
  }
  if (uVar12 == 0) {
    uVar11 = 0x200;
  }
  uVar12 = 1;
  if (uVar16 == 0) {
    uVar12 = uVar11;
  }
  local_40 = (CPUState *)(pCVar2[-4].tcs[0xd].mmr + 5);
  tb = pTVar9;
  local_50 = pCVar2;
LAB_007ecd71:
  local_80 = s->code_gen_ptr;
  (tb->tc).ptr = local_80;
  tb->pc = (target_ulong_conflict)local_58;
  tb->cs_base = local_70;
  tb->flags = local_6c;
  tb->cflags = local_78;
  tb->orig_tb = (TranslationBlock_conflict *)0x0;
  tb->trace_vcpu_dstate = (uint32_t)cpu->trace_dstate[0];
  s->tb_cflags = local_78;
  puVar15 = tb->jmp_reset_offset;
  do {
    tcg_func_start_mipsel((TCGContext_conflict4 *)s);
    s->cpu = local_40;
    local_74 = uVar12;
    gen_intermediate_code_mipsel(cpu,tb,uVar12);
    s->cpu = (CPUState *)0x0;
    tb->jmp_reset_offset[0] = 0xffff;
    tb->jmp_reset_offset[1] = 0xffff;
    s->tb_jmp_reset_offset = puVar15;
    s->tb_jmp_insn_offset = tb->jmp_target_arg;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar12 = tcg_gen_code_mipsel((TCGContext_conflict4 *)s,tb);
    if (-1 < (int)uVar12) {
      local_48 = (ulong)uVar12;
      local_68 = (byte *)((long)local_80 + local_48);
      uVar1 = tb->icount;
      pbVar14 = local_68;
      if ((ulong)uVar1 == 0) goto LAB_007ecf81;
      pTVar3 = cpu->uc->tcg_ctx;
      pbVar4 = (byte *)pTVar3->code_gen_highwater;
      uVar17 = 0;
      goto LAB_007ece8c;
    }
    tb_gen_code_mipsel_cold_1();
    uVar12 = local_88;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_007ecf95;
  while (uVar17 = uVar17 + 1, uVar17 != uVar1) {
LAB_007ece8c:
    lVar10 = 0;
    do {
      if (uVar17 == 0) {
        tVar18 = 0;
        if (lVar10 == 0) {
          tVar18 = tb->pc;
        }
      }
      else {
        tVar18 = *(target_ulong_conflict *)
                  ((long)(pTVar3->gen_insn_data + -1) + (uVar17 * 6 + lVar10 * 2 + 6) * 2);
      }
      pbVar13 = pbVar14;
      uVar12 = *(int *)((long)pTVar3->gen_insn_data[0] + lVar10 * 4 + uVar17 * 0xc) - tVar18;
      do {
        uVar11 = (int)uVar12 >> 7;
        bVar20 = 0x3f < uVar12;
        bVar21 = (uVar12 & 0x40) == 0;
        pbVar14 = pbVar13 + 1;
        bVar19 = (byte)uVar12 | 0x80;
        if (!bVar20 || !bVar21 && uVar11 == 0xffffffff) {
          bVar19 = (byte)uVar12 & 0x7f;
        }
        *pbVar13 = bVar19;
        pbVar13 = pbVar14;
        uVar12 = uVar11;
      } while (bVar20 && (bVar21 || uVar11 != 0xffffffff));
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (uVar17 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (uint)pTVar3->gen_insn_end_off[uVar17 - 1];
    }
    uVar12 = pTVar3->gen_insn_end_off[uVar17] - uVar12;
    do {
      uVar11 = (int)uVar12 >> 7;
      bVar20 = 0x3f < uVar12;
      bVar21 = (uVar12 & 0x40) == 0;
      pbVar14 = pbVar13 + 1;
      bVar19 = (byte)uVar12 | 0x80;
      if (!bVar20 || !bVar21 && uVar11 == 0xffffffff) {
        bVar19 = (byte)uVar12 & 0x7f;
      }
      *pbVar13 = bVar19;
      pbVar13 = pbVar14;
      uVar12 = uVar11;
    } while (bVar20 && (bVar21 || uVar11 != 0xffffffff));
    if (pbVar4 < pbVar14) {
      puVar15 = (uint16_t *)0xffffffff;
      goto LAB_007ecf8c;
    }
  }
LAB_007ecf81:
  puVar15 = (uint16_t *)(ulong)(uint)((int)pbVar14 - (int)local_68);
LAB_007ecf8c:
  if (-1 < (int)puVar15) goto LAB_007ecfbc;
LAB_007ecf95:
  tb = tcg_tb_alloc_mipsel((TCGContext_conflict4 *)s);
  uVar12 = local_74;
  if (tb == (TranslationBlock_conflict *)0x0) goto LAB_007ecfb2;
  goto LAB_007ecd71;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}